

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cpp
# Opt level: O2

string * anon_unknown.dwarf_5a2a5::prefix
                   (string *__return_storage_ptr__,bool prev_emitted,indent ind,string *property)

{
  undefined7 in_register_00000031;
  char *__lhs;
  indent ind_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  __lhs = "";
  if ((int)CONCAT71(in_register_00000031,prev_emitted) != 0) {
    __lhs = ",\n";
  }
  ind_local = ind;
  pstore::exchange::export_ns::indent::str_abi_cxx11_(&local_40,&ind_local);
  std::operator+(&local_a0,__lhs,&local_40);
  std::operator+(&local_80,&local_a0,'\"');
  std::operator+(&local_60,&local_80,property);
  std::operator+(__return_storage_ptr__,&local_60,"\":");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string prefix (bool prev_emitted, pstore::exchange::export_ns::indent const ind,
                        std::string const & property) {
        return (prev_emitted ? ",\n" : "") + ind.str () + '"' + property + "\":";
    }